

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

SUNErrCode N_VScaleVectorArray_Serial(int nvec,sunrealtype *c,N_Vector *X,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if (nvec == 1) {
    N_VScale_Serial(*c,*X,*Z);
  }
  else {
    lVar1 = *(*Z)->content;
    if (X == Z) {
      if (0 < nvec) {
        uVar3 = 0;
        do {
          if (0 < lVar1) {
            lVar2 = *(long *)((long)X[uVar3]->content + 0x10);
            lVar4 = 0;
            do {
              *(double *)(lVar2 + lVar4 * 8) = c[uVar3] * *(double *)(lVar2 + lVar4 * 8);
              lVar4 = lVar4 + 1;
            } while (lVar1 != lVar4);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != (uint)nvec);
      }
    }
    else if (0 < nvec) {
      uVar3 = 0;
      do {
        if (0 < lVar1) {
          lVar2 = *(long *)((long)X[uVar3]->content + 0x10);
          lVar4 = *(long *)((long)Z[uVar3]->content + 0x10);
          lVar5 = 0;
          do {
            *(double *)(lVar4 + lVar5 * 8) = c[uVar3] * *(double *)(lVar2 + lVar5 * 8);
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uint)nvec);
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleVectorArray_Serial(int nvec, sunrealtype* c, N_Vector* X,
                                      N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* zd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VScale */
  if (nvec == 1)
  {
    N_VScale_Serial(c[0], X[0], Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[i] *= c[i]
   */
  if (X == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { xd[j] *= c[i]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i] = c[i] * X[i]
   */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = c[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}